

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

string * __thiscall
anurbs::Entry<anurbs::Brep>::type_name_abi_cxx11_
          (string *__return_storage_ptr__,Entry<anurbs::Brep> *this)

{
  Entry<anurbs::Brep> *this_local;
  
  Brep::type_name_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const override
    {
        return TData::type_name();
    }